

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadLayerFromFile
               (string *_filename,Layer *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string base_dir;
  string filepath;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  string local_1c8;
  string local_1a8 [11];
  
  if (_filename->_M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tinyusdz.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"LoadLayerFromFile");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x53d);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1a8,"Input filename is empty.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    bVar2 = false;
  }
  else {
    bVar2 = false;
    io::ExpandFilePath(local_1a8,(string *)_filename,(void *)0x0);
    io::GetBaseDir(&local_1c8,(string *)_filename);
    local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8,
                              (string *)err,local_1a8,(long)options->max_memory_limit_in_mb << 0x14,
                              (void *)0x0);
    if (bVar1) {
      bVar2 = LoadLayerFromMemory(local_1e8._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1e8._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1e8._M_impl.super__Vector_impl_data._M_start,
                                  (string *)local_1a8,stage,warn,err,options);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1e8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  return bVar2;
}

Assistant:

bool LoadLayerFromFile(const std::string &_filename, Layer *stage,
                     std::string *warn, std::string *err,
                     const USDLoadOptions &options) {

  if (_filename.empty()) {
    PUSH_ERROR_AND_RETURN("Input filename is empty.");
  }

  // TODO: Use AssetResolutionResolver.
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);
  std::string base_dir = io::GetBaseDir(_filename);

  std::vector<uint8_t> data;
  size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
  if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                         /* userdata */ nullptr)) {
    return false;
  }

  return LoadLayerFromMemory(data.data(), data.size(), filepath, stage, warn, err,
                           options);
}